

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.h
# Opt level: O2

bool __thiscall llvm::Triple::isCompatibleWith(Triple *this,Triple *Other)

{
  ArchType AVar1;
  SubArchType SVar2;
  int iVar3;
  
  AVar1 = this->Arch;
  if (AVar1 == arm) {
    if (Other->Arch != thumb) goto LAB_00158cc7;
  }
  else if (AVar1 == armeb) {
    if (Other->Arch != thumbeb) goto LAB_00158cc7;
  }
  else if (AVar1 == thumbeb) {
    if (Other->Arch != armeb) goto LAB_00158cc7;
  }
  else if ((AVar1 != thumb) || (Other->Arch != arm)) {
LAB_00158cc7:
    if (this->Vendor != Apple) {
      iVar3 = memcmp(&this->Arch,&Other->Arch,0x18);
      return iVar3 == 0;
    }
    if (AVar1 != Other->Arch) {
      return false;
    }
    if (this->SubArch != Other->SubArch) {
      return false;
    }
    if (Other->Vendor != Apple) {
      return false;
    }
    goto LAB_00158ce6;
  }
  SVar2 = this->SubArch ^ Other->SubArch;
  if (this->Vendor != Apple) {
    if (this->Vendor != Other->Vendor || SVar2 != NoSubArch) {
      return false;
    }
    if (this->OS == Other->OS) {
      if (this->Environment == Other->Environment) {
        return this->ObjectFormat == Other->ObjectFormat;
      }
      return false;
    }
    return false;
  }
  if (Other->Vendor != Apple || SVar2 != NoSubArch) {
    return false;
  }
LAB_00158ce6:
  return this->OS == Other->OS;
}

Assistant:

SubArchType getSubArch() const { return SubArch; }